

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O3

Accel * __thiscall
embree::BVH4Factory::BVH4Triangle4vMB
          (BVH4Factory *this,Scene *scene,BuildVariant bvariant,IntersectVariant ivariant)

{
  int iVar1;
  BVHN<4> *pBVar2;
  Builder *pBVar3;
  Accel *pAVar4;
  undefined8 *puVar5;
  long *plVar6;
  Intersectors intersectors;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  BVHN<4> *local_260;
  long local_258;
  _func_int **pp_Stack_250;
  atomic<unsigned_long> local_248;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_240;
  undefined1 local_228 [8];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_220;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_210 [3];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  char *local_1c8;
  char *local_180;
  Intersectors local_148;
  
  pBVar2 = (BVHN<4> *)alignedMalloc(0x240,0x10);
  BVHN<4>::BVHN(pBVar2,(PrimitiveType *)&TriangleMvMB<4>::type,scene);
  local_148.intersector1.intersect = (IntersectFunc)0x0;
  local_148.intersector1.occluded = (OccludedFunc)0x0;
  local_148.collider.collide = (CollideFunc)0x0;
  local_148.collider.name = (char *)0x0;
  local_148.ptr = (AccelData *)0x0;
  local_148.leafIntersector = (__pointer_type)0x0;
  memset(&local_148.intersector1.name,0,0xe0);
  iVar1 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0xb0));
  if (iVar1 == 0) {
    BVH4Triangle4vMBIntersectors(&local_148,this,pBVar2,ivariant);
  }
  else {
    iVar1 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0xb0));
    local_260 = pBVar2;
    if (iVar1 == 0) {
      local_248.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
      aStack_240._0_8_ = 0;
      local_258 = 0;
      pp_Stack_250 = (_func_int **)0x0;
      aStack_240._8_8_ = 0;
      memset(local_228,0,0xe0);
      (*this->BVH4Triangle4vMBIntersector1Moeller)((Intersector1 *)&aStack_240.field_1);
      (*this->BVH4Triangle4vMBIntersector4HybridMoeller)((Intersector4 *)local_280);
      local_210[0]._0_8_ = local_270._M_allocated_capacity;
      local_220.m128[0] = (float)local_280._0_4_;
      local_220.m128[1] = (float)local_280._4_4_;
      local_220.m128[2] = fStack_278;
      local_220.m128[3] = fStack_274;
      (*this->BVH4Triangle4vMBIntersector8HybridMoeller)((Intersector8 *)local_280);
      local_1c8 = (char *)local_270._M_allocated_capacity;
      local_1d8 = (float)local_280._0_4_;
      fStack_1d4 = (float)local_280._4_4_;
      fStack_1d0 = fStack_278;
      fStack_1cc = fStack_274;
      (*this->BVH4Triangle4vMBIntersector16HybridMoeller)((Intersector16 *)local_280);
    }
    else {
      iVar1 = std::__cxx11::string::compare
                        ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0xb0));
      if (iVar1 != 0) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_280,"unknown traverser ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(scene->super_AccelN).field_0x188 + 0xb0));
        plVar6 = (long *)std::__cxx11::string::append(local_280);
        local_260 = (BVHN<4> *)*plVar6;
        pBVar2 = (BVHN<4> *)(plVar6 + 2);
        if (local_260 == pBVar2) {
          pp_Stack_250 = (pBVar2->super_AccelData).super_RefCount._vptr_RefCount;
          local_248.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)plVar6[3];
          local_260 = (BVHN<4> *)&pp_Stack_250;
        }
        else {
          pp_Stack_250 = (pBVar2->super_AccelData).super_RefCount._vptr_RefCount;
        }
        local_258 = plVar6[1];
        *plVar6 = (long)pBVar2;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        *puVar5 = &PTR__rtcore_error_02184a18;
        *(undefined4 *)(puVar5 + 1) = 2;
        puVar5[2] = puVar5 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar5 + 2),local_260,
                   (long)&(local_260->super_AccelData).super_RefCount._vptr_RefCount + local_258);
        __cxa_throw(puVar5,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      local_248.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
      aStack_240._0_8_ = 0;
      local_258 = 0;
      pp_Stack_250 = (_func_int **)0x0;
      aStack_240._8_8_ = 0;
      memset(local_228,0,0xe0);
      (*this->BVH4Triangle4vMBIntersector1Pluecker)((Intersector1 *)&aStack_240.field_1);
      (*this->BVH4Triangle4vMBIntersector4HybridPluecker)((Intersector4 *)local_280);
      local_210[0]._0_8_ = local_270._M_allocated_capacity;
      local_220.m128[0] = (float)local_280._0_4_;
      local_220.m128[1] = (float)local_280._4_4_;
      local_220.m128[2] = fStack_278;
      local_220.m128[3] = fStack_274;
      (*this->BVH4Triangle4vMBIntersector8HybridPluecker)((Intersector8 *)local_280);
      local_1c8 = (char *)local_270._M_allocated_capacity;
      local_1d8 = (float)local_280._0_4_;
      fStack_1d4 = (float)local_280._4_4_;
      fStack_1d0 = fStack_278;
      fStack_1cc = fStack_274;
      (*this->BVH4Triangle4vMBIntersector16HybridPluecker)((Intersector16 *)local_280);
    }
    local_180 = (char *)local_270._M_allocated_capacity;
    memcpy(&local_148,&local_260,0x118);
  }
  iVar1 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x90));
  if (iVar1 == 0) {
    if (bvariant != STATIC) {
      pBVar3 = (Builder *)0x0;
      goto LAB_00b91874;
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x90));
    if (iVar1 != 0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                     "unknown builder ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)&(scene->super_AccelN).field_0x188 + 0x90));
      plVar6 = (long *)std::__cxx11::string::append(local_280);
      local_260 = (BVHN<4> *)*plVar6;
      pBVar2 = (BVHN<4> *)(plVar6 + 2);
      if (local_260 == pBVar2) {
        pp_Stack_250 = (pBVar2->super_AccelData).super_RefCount._vptr_RefCount;
        local_248.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)plVar6[3];
        local_260 = (BVHN<4> *)&pp_Stack_250;
      }
      else {
        pp_Stack_250 = (pBVar2->super_AccelData).super_RefCount._vptr_RefCount;
      }
      local_258 = plVar6[1];
      *plVar6 = (long)pBVar2;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      *puVar5 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar5 + 1) = 2;
      puVar5[2] = puVar5 + 4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar5 + 2),local_260,
                 (long)&(local_260->super_AccelData).super_RefCount._vptr_RefCount + local_258);
      __cxa_throw(puVar5,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  pBVar3 = (*this->BVH4Triangle4vMBSceneBuilderSAH)(pBVar2,scene,0);
LAB_00b91874:
  pAVar4 = (Accel *)alignedMalloc(0x180,0x10);
  (pAVar4->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  (pAVar4->super_AccelData).type = TY_ACCEL_INSTANCE;
  memcpy(&(pAVar4->super_AccelData).field_0x58,&local_148,0x118);
  (pAVar4->super_AccelData).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AccelInstance_0218ab40;
  pAVar4[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)pBVar2;
  pAVar4[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)pBVar3;
  return pAVar4;
}

Assistant:

Accel* BVH4Factory::BVH4Triangle4vMB(Scene* scene, BuildVariant bvariant, IntersectVariant ivariant)
  {
    BVH4* accel = new BVH4(Triangle4vMB::type,scene);

    Accel::Intersectors intersectors;
    if      (scene->device->tri_traverser_mb == "default") intersectors = BVH4Triangle4vMBIntersectors(accel,ivariant);
    else if (scene->device->tri_traverser_mb == "fast"   ) intersectors = BVH4Triangle4vMBIntersectors(accel,IntersectVariant::FAST);
    else if (scene->device->tri_traverser_mb == "robust" ) intersectors = BVH4Triangle4vMBIntersectors(accel,IntersectVariant::ROBUST);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown traverser "+scene->device->tri_traverser_mb+" for BVH4<Triangle4vMB>");

    Builder* builder = nullptr;
    if (scene->device->tri_builder_mb == "default") {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH4Triangle4vMBSceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : assert(false); break; // FIXME: implement
      case BuildVariant::HIGH_QUALITY: assert(false); break;
      }
    }
    else  if (scene->device->tri_builder_mb == "internal_time_splits") builder = BVH4Triangle4vMBSceneBuilderSAH(accel,scene,0);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->tri_builder_mb+" for BVH4<Triangle4vMB>");

    return new AccelInstance(accel,builder,intersectors);
  }